

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O2

Vec_Int_t * Abc_SclFindCriticalNodeWindow(SC_Man *p,Vec_Int_t *vPathCos,int Window,int fDept)

{
  float fVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  int i;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar4;
  SC_Man *pSVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  
  pSVar5 = p;
  fVar7 = Abc_SclReadMaxDelay(p);
  p_00 = Vec_IntAlloc((int)pSVar5);
  Abc_NtkIncrementTravId(p->pNtk);
  for (iVar6 = 0; iVar3 = vPathCos->nSize, iVar6 < iVar3; iVar6 = iVar6 + 1) {
    pAVar2 = p->pNtk;
    iVar3 = Vec_IntEntry(vPathCos,iVar6);
    pAVar4 = Abc_NtkObj(pAVar2,iVar3);
    if (pAVar4 != (Abc_Obj_t *)0x0) {
      fVar8 = p->pTimes[(uint)pAVar4->Id].rise;
      fVar1 = p->pTimes[(uint)pAVar4->Id].fall;
      if (fVar8 <= fVar1) {
        fVar8 = fVar1;
      }
      fVar8 = ((float)Window * fVar7) / 100.0 - (fVar7 - fVar8);
      if (0.0 <= fVar8) {
        Abc_SclFindCriticalNodeWindow_rec
                  (p,(Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray],p_00,fVar8,
                   fDept);
      }
    }
  }
  for (iVar6 = 0; iVar6 < iVar3; iVar6 = iVar6 + 1) {
    pAVar2 = p->pNtk;
    iVar3 = Vec_IntEntry(vPathCos,iVar6);
    pAVar4 = Abc_NtkObj(pAVar2,iVar3);
    if (pAVar4 != (Abc_Obj_t *)0x0) {
      pAVar4->field_0x14 = pAVar4->field_0x14 | 0x10;
    }
    iVar3 = vPathCos->nSize;
  }
  iVar6 = p_00->nSize;
  iVar3 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar3; iVar3 = iVar3 + 1) {
    pAVar2 = p->pNtk;
    i = Vec_IntEntry(p_00,iVar3);
    pAVar4 = Abc_NtkObj(pAVar2,i);
    if (pAVar4 != (Abc_Obj_t *)0x0) {
      pAVar4->field_0x14 = pAVar4->field_0x14 | 0x10;
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Abc_SclFindCriticalNodeWindow( SC_Man * p, Vec_Int_t * vPathCos, int Window, int fDept )
{
    float fMaxArr = Abc_SclReadMaxDelay( p );
    float fSlackMax = fMaxArr * Window / 100.0;
    Vec_Int_t * vPath = Vec_IntAlloc( 100 );
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkIncrementTravId( p->pNtk ); 
    Abc_NtkForEachObjVec( vPathCos, p->pNtk, pObj, i )
    {
        float fSlackThis = fSlackMax - (fMaxArr - Abc_SclObjTimeMax(p, pObj));
        if ( fSlackThis >= 0 )
            Abc_SclFindCriticalNodeWindow_rec( p, Abc_ObjFanin0(pObj), vPath, fSlackThis, fDept );
    }
    // label critical nodes
    Abc_NtkForEachObjVec( vPathCos, p->pNtk, pObj, i )
        pObj->fMarkA = 1;
    Abc_NtkForEachObjVec( vPath, p->pNtk, pObj, i )
        pObj->fMarkA = 1;
    return vPath;  
}